

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugHookIdInfo(ImGuiID id,ImGuiDataType data_type,void *data_id,void *data_id_end)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiStackLevelInfo *pIVar5;
  ImGuiContext *pIVar6;
  ulong uVar7;
  ImGuiStackLevelInfo *__dest;
  long lVar8;
  size_t sVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  uint uVar13;
  ImGuiContext *ctx;
  int iVar14;
  int iVar15;
  
  pIVar6 = GImGui;
  uVar12 = (ulong)id;
  pIVar4 = GImGui->CurrentWindow;
  uVar13 = (GImGui->DebugStackTool).StackLevel;
  uVar7 = (ulong)uVar13;
  if (uVar7 == 0xffffffff) {
    (GImGui->DebugStackTool).StackLevel = 0;
    iVar2 = (pIVar4->IDStack).Size;
    iVar3 = (pIVar6->DebugStackTool).Results.Capacity;
    iVar15 = (int)((long)iVar2 + 1);
    if (iVar3 <= iVar2) {
      if (iVar3 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar3 / 2 + iVar3;
      }
      if (iVar14 <= iVar15) {
        iVar14 = iVar15;
      }
      if (iVar3 < iVar14) {
        if (pIVar6 != (ImGuiContext *)0x0) {
          piVar1 = &(pIVar6->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiStackLevelInfo *)
                 (*GImAllocatorAllocFunc)((long)iVar14 << 6,GImAllocatorUserData);
        pIVar5 = (pIVar6->DebugStackTool).Results.Data;
        if (pIVar5 != (ImGuiStackLevelInfo *)0x0) {
          memcpy(__dest,pIVar5,(long)(pIVar6->DebugStackTool).Results.Size << 6);
          pIVar5 = (pIVar6->DebugStackTool).Results.Data;
          if ((pIVar5 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
        }
        (pIVar6->DebugStackTool).Results.Data = __dest;
        (pIVar6->DebugStackTool).Results.Capacity = iVar14;
      }
    }
    iVar3 = (pIVar6->DebugStackTool).Results.Size;
    if (iVar3 <= iVar2) {
      lVar10 = ((long)iVar2 + 1) - (long)iVar3;
      lVar8 = (long)iVar3 << 6;
      do {
        pIVar5 = (pIVar6->DebugStackTool).Results.Data;
        pcVar11 = pIVar5->Desc + lVar8 + 0x29;
        pcVar11[0] = '\0';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        pcVar11[3] = '\0';
        pcVar11[4] = '\0';
        pcVar11[5] = '\0';
        pcVar11[6] = '\0';
        pcVar11[7] = '\0';
        pcVar11[8] = '\0';
        pcVar11[9] = '\0';
        pcVar11[10] = '\0';
        pcVar11[0xb] = '\0';
        pcVar11[0xc] = '\0';
        pcVar11[0xd] = '\0';
        pcVar11[0xe] = '\0';
        pcVar11[0xf] = '\0';
        pcVar11 = pIVar5->Desc + lVar8 + 0x19;
        pcVar11[0] = '\0';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        pcVar11[3] = '\0';
        pcVar11[4] = '\0';
        pcVar11[5] = '\0';
        pcVar11[6] = '\0';
        pcVar11[7] = '\0';
        pcVar11[8] = '\0';
        pcVar11[9] = '\0';
        pcVar11[10] = '\0';
        pcVar11[0xb] = '\0';
        pcVar11[0xc] = '\0';
        pcVar11[0xd] = '\0';
        pcVar11[0xe] = '\0';
        pcVar11[0xf] = '\0';
        pcVar11 = pIVar5->Desc + lVar8 + 9;
        pcVar11[0] = '\0';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        pcVar11[3] = '\0';
        pcVar11[4] = '\0';
        pcVar11[5] = '\0';
        pcVar11[6] = '\0';
        pcVar11[7] = '\0';
        pcVar11[8] = '\0';
        pcVar11[9] = '\0';
        pcVar11[10] = '\0';
        pcVar11[0xb] = '\0';
        pcVar11[0xc] = '\0';
        pcVar11[0xd] = '\0';
        pcVar11[0xe] = '\0';
        pcVar11[0xf] = '\0';
        pcVar11 = pIVar5->Desc + lVar8 + -7;
        pcVar11[0] = '\0';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        pcVar11[3] = '\0';
        pcVar11[4] = '\0';
        pcVar11[5] = '\0';
        pcVar11[6] = '\0';
        pcVar11[7] = '\0';
        pcVar11[8] = '\0';
        pcVar11[9] = '\0';
        pcVar11[10] = '\0';
        pcVar11[0xb] = '\0';
        pcVar11[0xc] = '\0';
        pcVar11[0xd] = '\0';
        pcVar11[0xe] = '\0';
        pcVar11[0xf] = '\0';
        lVar8 = lVar8 + 0x40;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    (pIVar6->DebugStackTool).Results.Size = iVar15;
    iVar2 = (pIVar4->IDStack).Size;
    if ((long)iVar2 < 0) {
      return;
    }
    uVar12 = 0;
    while( true ) {
      uVar13 = id;
      if (uVar12 < (ulong)(long)iVar2) {
        uVar13 = (pIVar4->IDStack).Data[uVar12];
      }
      if ((long)(pIVar6->DebugStackTool).Results.Size <= (long)uVar12) break;
      (pIVar6->DebugStackTool).Results.Data[uVar12].ID = uVar13;
      uVar12 = uVar12 + 1;
      if (uVar12 == iVar2 + 1) {
        return;
      }
    }
LAB_0014f5d4:
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                  ,0x74f,
                  "T &ImVector<ImGuiStackLevelInfo>::operator[](int) [T = ImGuiStackLevelInfo]");
  }
  if ((int)uVar13 < 0) {
    __assert_fail("tool->StackLevel >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x491f,
                  "void ImGui::DebugHookIdInfo(ImGuiID, ImGuiDataType, const void *, const void *)")
    ;
  }
  if (uVar13 != (pIVar4->IDStack).Size) {
    return;
  }
  if ((GImGui->DebugStackTool).Results.Size <= (int)uVar13) goto LAB_0014f5d4;
  pIVar5 = (GImGui->DebugStackTool).Results.Data;
  if ((pIVar5[uVar7].ID != id) || (pIVar5[uVar7].QueryFrameCount < '\x01')) {
    __assert_fail("info->ID == id && info->QueryFrameCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x4923,
                  "void ImGui::DebugHookIdInfo(ImGuiID, ImGuiDataType, const void *, const void *)")
    ;
  }
  switch(data_type) {
  case 4:
    pcVar11 = "%d";
    uVar12 = (ulong)data_id & 0xffffffff;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x4936,
                  "void ImGui::DebugHookIdInfo(ImGuiID, ImGuiDataType, const void *, const void *)")
    ;
  case 0xb:
    if (data_id_end == (void *)0x0) {
      sVar9 = strlen((char *)data_id);
    }
    else {
      sVar9 = (long)data_id_end - (long)data_id;
    }
    ImFormatString(pIVar5[uVar7].Desc,0x39,"%.*s",sVar9,data_id);
    goto LAB_0014f5ba;
  case 0xc:
    ImFormatString(pIVar5[uVar7].Desc,0x39,"(void*)0x%p",data_id);
    goto LAB_0014f5ba;
  case 0xd:
    if (pIVar5[uVar7].Desc[0] != '\0') {
      return;
    }
    pcVar11 = "0x%08X [override]";
  }
  ImFormatString(pIVar5[uVar7].Desc,0x39,pcVar11,uVar12);
LAB_0014f5ba:
  pIVar5[uVar7].QuerySuccess = true;
  pIVar5[uVar7].field_0x6 = (char)data_type;
  return;
}

Assistant:

void ImGui::DebugHookIdInfo(ImGuiID id, ImGuiDataType data_type, const void* data_id, const void* data_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackTool* tool = &g.DebugStackTool;

    // Step 0: stack query
    // This assume that the ID was computed with the current ID stack, which tends to be the case for our widget.
    if (tool->StackLevel == -1)
    {
        tool->StackLevel++;
        tool->Results.resize(window->IDStack.Size + 1, ImGuiStackLevelInfo());
        for (int n = 0; n < window->IDStack.Size + 1; n++)
            tool->Results[n].ID = (n < window->IDStack.Size) ? window->IDStack[n] : id;
        return;
    }

    // Step 1+: query for individual level
    IM_ASSERT(tool->StackLevel >= 0);
    if (tool->StackLevel != window->IDStack.Size)
        return;
    ImGuiStackLevelInfo* info = &tool->Results[tool->StackLevel];
    IM_ASSERT(info->ID == id && info->QueryFrameCount > 0);

    switch (data_type)
    {
    case ImGuiDataType_S32:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%d", (int)(intptr_t)data_id);
        break;
    case ImGuiDataType_String:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%.*s", data_id_end ? (int)((const char*)data_id_end - (const char*)data_id) : (int)strlen((const char*)data_id), (const char*)data_id);
        break;
    case ImGuiDataType_Pointer:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "(void*)0x%p", data_id);
        break;
    case ImGuiDataType_ID:
        if (info->Desc[0] != 0) // PushOverrideID() is often used to avoid hashing twice, which would lead to 2 calls to DebugHookIdInfo(). We prioritize the first one.
            return;
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "0x%08X [override]", id);
        break;
    default:
        IM_ASSERT(0);
    }
    info->QuerySuccess = true;
    info->DataType = data_type;
}